

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFHighLevelEncoder.cpp
# Opt level: O0

void ZXing::Pdf417::EncodeBinary
               (string *bytes,int startpos,int count,int startmode,
               vector<int,_std::allocator<int>_> *output)

{
  long lVar1;
  byte *pbVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  ulong in_RDI;
  int ch;
  int i_3;
  int i_2;
  int i_1;
  int i;
  long t;
  int chars [5];
  int idx;
  int local_50;
  int local_4c;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  undefined4 local_38 [5];
  int local_24;
  int local_10;
  int local_c;
  ulong local_8;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  if ((in_EDX == 1) && (in_ECX == 0)) {
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffc0,
               (value_type_conflict3 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
              );
  }
  else if (in_EDX % 6 == 0) {
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffc0,
               (value_type_conflict3 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
              );
  }
  else {
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffc0,
               (value_type_conflict3 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
              );
  }
  local_24 = local_c;
  if (5 < local_10) {
    for (; 5 < (local_c + local_10) - local_24; local_24 = local_24 + 6) {
      in_stack_ffffffffffffffc0 = (vector<int,_std::allocator<int>_> *)0x0;
      for (in_stack_ffffffffffffffbc = 0; in_stack_ffffffffffffffbc < 6;
          in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
        lVar1 = (long)in_stack_ffffffffffffffc0 << 8;
        pbVar2 = (byte *)std::__cxx11::string::operator[](local_8);
        in_stack_ffffffffffffffc0 =
             (vector<int,_std::allocator<int>_> *)((int)(uint)*pbVar2 + lVar1);
      }
      for (in_stack_ffffffffffffffb8 = 0; in_stack_ffffffffffffffb8 < 5;
          in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
        local_38[in_stack_ffffffffffffffb8] = (int)((long)in_stack_ffffffffffffffc0 % 900);
        in_stack_ffffffffffffffc0 =
             (vector<int,_std::allocator<int>_> *)((long)in_stack_ffffffffffffffc0 / 900);
      }
      for (local_4c = 4; -1 < local_4c; local_4c = local_4c + -1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (in_stack_ffffffffffffffc0,
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      }
    }
  }
  for (local_50 = local_24; local_50 < local_c + local_10; local_50 = local_50 + 1) {
    std::__cxx11::string::operator[](local_8);
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffc0,
               (value_type_conflict3 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
              );
  }
  return;
}

Assistant:

static void EncodeBinary(const std::string& bytes, int startpos, int count, int startmode, std::vector<int>& output)
{
	if (count == 1 && startmode == TEXT_COMPACTION) {
		output.push_back(SHIFT_TO_BYTE);
	}
	else {
		if ((count % 6) == 0) {
			output.push_back(LATCH_TO_BYTE);
		}
		else {
			output.push_back(LATCH_TO_BYTE_PADDED);
		}
	}

	int idx = startpos;
	// Encode sixpacks
	if (count >= 6) {
		int chars[5];
		while ((startpos + count - idx) >= 6) {
			long t = 0;
			for (int i = 0; i < 6; i++) {
				t <<= 8;
				t += bytes[idx + i] & 0xff;
			}
			for (int i = 0; i < 5; i++) {
				chars[i] = t % 900;
				t /= 900;
			}
			for (int i = 4; i >= 0; i--) {
				output.push_back(chars[i]);
			}
			idx += 6;
		}
	}
	//Encode rest (remaining n<5 bytes if any)
	for (int i = idx; i < startpos + count; i++) {
		int ch = bytes[i] & 0xff;
		output.push_back(ch);
	}
}